

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_revxspc(char *s,char *n,size_t len)

{
  char cVar1;
  __int32_t **pp_Var2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar3 = len - 1;
  lVar7 = lVar3;
  lVar5 = -1;
  if (lVar3 < -1) {
    lVar5 = lVar3;
  }
  for (; pcVar4 = n, lVar6 = lVar5, -1 < lVar7; lVar7 = lVar7 + -1) {
    while (cVar1 = *pcVar4, (long)cVar1 != 0) {
      pp_Var2 = __ctype_tolower_loc();
      pcVar4 = pcVar4 + 1;
      lVar6 = lVar7;
      if ((*pp_Var2)[s[lVar7]] == (*pp_Var2)[cVar1]) goto LAB_00106484;
    }
  }
LAB_00106484:
  return lVar3 - lVar6;
}

Assistant:

size_t coda_revxspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}